

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditor::DoQuadPoint(CEditor *this,CQuad *pQuad,int QuadIndex,int V)

{
  CPoint *pCVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  byte bVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  long in_FS_OFFSET;
  float fVar18;
  int iVar20;
  undefined1 auVar19 [16];
  float fVar21;
  float fVar22;
  float fVar26;
  CPoint CVar23;
  CPoint CVar24;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 local_40;
  float local_38;
  float local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = pQuad->m_aPoints + V;
  fVar3 = (this->m_UI).m_MouseWorldX;
  fVar4 = (this->m_UI).m_MouseWorldY;
  fVar21 = (float)(*pCVar1).x * 0.0009765625;
  fVar26 = (float)(*pCVar1).y * 0.0009765625;
  fVar22 = (fVar21 - fVar3) / this->m_WorldZoom;
  fVar18 = (fVar26 - fVar4) / this->m_WorldZoom;
  if (fVar22 * fVar22 + fVar18 * fVar18 < 50.0) {
    (this->m_UI).m_pBecommingHotItem = pCVar1;
  }
  if ((this->m_SelectedQuad == QuadIndex) &&
     (((uint)this->m_SelectedPoints >> (V & 0x1fU) & 1) != 0)) {
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    local_38 = this->m_WorldZoom * 7.0;
    local_40 = CONCAT44(fVar26,fVar21);
    local_34 = local_38;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_40,1);
  }
  iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x162);
  cVar8 = '\x01';
  if ((char)iVar9 == '\0') {
    iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x166);
    cVar8 = (char)iVar9;
  }
  bVar10 = (byte)V;
  if ((CPoint *)(this->m_UI).m_pActiveItem == pCVar1) {
    (this->m_UI).m_ActiveItemValid = true;
    uVar5 = this->m_MouseDeltaWx;
    uVar6 = this->m_MouseDeltaWy;
    if ((DoQuadPoint(CQuad*,int,int)::s_Moved == '\0') &&
       (0.5 < (float)uVar5 * (float)uVar5 + (float)uVar6 * (float)uVar6)) {
      DoQuadPoint(CQuad*,int,int)::s_Moved = '\x01';
    }
    cVar7 = DoQuadPoint(CQuad*,int,int)::s_Moved;
    if (DoQuadPoint(CQuad*,int,int)::s_Moved == '\x01') {
      if (DoQuadPoint::s_Operation == 1) {
        uVar17 = this->m_SelectedPoints;
        if (cVar8 == '\0' && this->m_GridActive == true) {
          iVar9 = this->m_ZoomLevel;
          uVar16 = 0x80;
          if (0x352 < iVar9) {
            uVar16 = (uint)(0x60e < iVar9) * 0x100 + 0x100;
          }
          bVar15 = 7;
          if (0x352 < iVar9) {
            bVar15 = iVar9 < 0x60f ^ 9;
          }
          uVar14 = 0x40;
          if (iVar9 < 0xfb) {
            uVar14 = (uint)(100 < iVar9) * 0x10 + 0x10;
          }
          bVar11 = 6;
          if (iVar9 < 0xfb) {
            bVar11 = iVar9 < 0x65 ^ 5;
          }
          if (0x1c2 < iVar9) {
            uVar14 = uVar16;
          }
          if (0x1c2 < iVar9) {
            bVar11 = bVar15;
          }
          fVar18 = (float)(int)((uVar14 >> 1) * this->m_GridFactor);
          iVar9 = this->m_GridFactor << bVar11;
          lVar12 = 0;
          do {
            if ((uVar17 >> ((uint)lVar12 & 0x1f) & 1) != 0) {
              pQuad->m_aPoints[lVar12].x =
                   (int)((float)((int)(((float)(-(uint)(fVar3 < 0.0) & (uint)-fVar18 |
                                               ~-(uint)(fVar3 < 0.0) & (uint)fVar18) + fVar3) /
                                      (float)iVar9) * iVar9) * 1024.0);
              pQuad->m_aPoints[lVar12].y =
                   (int)((float)((int)(((float)(-(uint)(fVar4 < 0.0) & (uint)-fVar18 |
                                               ~-(uint)(fVar4 < 0.0) & (uint)fVar18) + fVar4) /
                                      (float)iVar9) * iVar9) * 1024.0);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
        }
        else {
          lVar12 = 0;
          do {
            if ((uVar17 >> ((uint)lVar12 & 0x1f) & 1) != 0) {
              CVar24.x = pQuad->m_aPoints[lVar12].x + (int)((float)uVar5 * 1024.0);
              CVar24.y = pQuad->m_aPoints[lVar12].y + (int)((float)uVar6 * 1024.0);
              pQuad->m_aPoints[lVar12] = CVar24;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
        }
      }
      else if (DoQuadPoint::s_Operation == 2) {
        uVar17 = this->m_SelectedPoints;
        iVar9 = (int)((float)uVar5 * 0.001 * 1024.0);
        iVar20 = (int)((float)uVar6 * 0.001 * 1024.0);
        uVar13 = 0;
        do {
          if ((uVar17 >> ((uint)uVar13 & 0x1f) & 1) != 0) {
            CVar23.x = pQuad->m_aTexcoords[uVar13].x + iVar9;
            CVar23.y = pQuad->m_aTexcoords[uVar13].y + iVar20;
            pQuad->m_aTexcoords[uVar13] = CVar23;
            pQuad->m_aTexcoords[uVar13 ^ 2].x = pQuad->m_aTexcoords[uVar13 ^ 2].x + iVar9;
            piVar2 = &pQuad->m_aTexcoords[uVar13 ^ 1].y;
            *piVar2 = *piVar2 + iVar20;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != 4);
      }
    }
    uVar17 = (this->m_UI).m_MouseButtons;
    if (DoQuadPoint::s_Operation == 3) {
      if ((uVar17 & 2) == 0) {
        CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0x78,0x96
                         ,this,PopupPoint,0xf);
LAB_00198bd2:
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = (void *)0x0;
      }
    }
    else if ((uVar17 & 1) == 0) {
      if (cVar7 == '\0') {
        iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
        if (((char)iVar9 == '\0') &&
           (iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165),
           (char)iVar9 == '\0')) {
          this->m_SelectedPoints = 1 << (bVar10 & 0x1f);
        }
        else {
          this->m_SelectedPoints = this->m_SelectedPoints ^ 1 << (bVar10 & 0x1f);
        }
      }
      this->m_LockMouse = false;
      goto LAB_00198bd2;
    }
    uVar17 = this->m_pConfig->m_EdColorQuadPointActive;
  }
  else {
    if ((CPoint *)(this->m_UI).m_pHotItem == pCVar1) {
      uVar17 = this->m_pConfig->m_EdColorQuadPointHover;
      uVar13 = CONCAT44(uVar17 >> 0x10,uVar17 >> 0x18) & 0xffffffffff;
      auVar27._4_4_ = uVar17;
      auVar27._0_4_ = uVar17 >> 8;
      auVar27._8_8_ = 0;
      ms_pUiGotContext = pCVar1;
      this->m_pTooltip =
           "Left mouse button to move. Hold shift to move the texture. Hold alt to ignore grid.";
      uVar17 = (this->m_UI).m_MouseButtons;
      if ((uVar17 & 1) == 0) {
        if ((uVar17 & 2) != 0) {
          DoQuadPoint::s_Operation = 3;
          this->m_SelectedQuad = QuadIndex;
          (this->m_UI).m_ActiveItemValid = true;
          (this->m_UI).m_pActiveItem = pCVar1;
          (this->m_UI).m_pLastActiveItem = pCVar1;
          uVar17 = 1 << (bVar10 & 0x1f);
          if (((uint)this->m_SelectedPoints >> (V & 0x1fU) & 1) == 0) {
            iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
            if (((char)iVar9 != '\0') ||
               (iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])
                                  (this->m_pInput,0x165), (char)iVar9 != '\0')) {
              uVar17 = uVar17 | this->m_SelectedPoints;
            }
            this->m_SelectedPoints = uVar17;
            DoQuadPoint(CQuad*,int,int)::s_Moved = '\x01';
          }
        }
      }
      else {
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = pCVar1;
        (this->m_UI).m_pLastActiveItem = pCVar1;
        DoQuadPoint(CQuad*,int,int)::s_Moved = '\0';
        iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
        if (((char)iVar9 == '\0') &&
           (iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165),
           (char)iVar9 == '\0')) {
          DoQuadPoint::s_Operation = 1;
        }
        else {
          DoQuadPoint::s_Operation = 2;
          this->m_LockMouse = true;
        }
        uVar17 = 1 << (bVar10 & 0x1f);
        if (((uint)this->m_SelectedPoints >> (V & 0x1fU) & 1) == 0) {
          iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
          if (((char)iVar9 != '\0') ||
             (iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])
                                (this->m_pInput,0x165), (char)iVar9 != '\0')) {
            uVar17 = uVar17 | this->m_SelectedPoints;
          }
          this->m_SelectedPoints = uVar17;
          DoQuadPoint(CQuad*,int,int)::s_Moved = '\x01';
        }
        this->m_SelectedQuad = QuadIndex;
      }
      goto LAB_00198c10;
    }
    uVar17 = this->m_pConfig->m_EdColorQuadPoint;
  }
  uVar13 = CONCAT44(uVar17 >> 0x10,uVar17 >> 0x18) & 0xffffffffff;
  auVar27._4_4_ = uVar17;
  auVar27._0_4_ = uVar17 >> 8;
  auVar27._8_8_ = 0;
LAB_00198c10:
  auVar25._0_8_ = uVar13 & 0xffffffff;
  auVar25._8_4_ = (int)(uVar13 >> 0x20);
  auVar25._12_4_ = 0;
  auVar19._0_4_ = (float)(SUB168(auVar25 | _DAT_001dfc30,0) - (double)DAT_001dfc30);
  auVar19._4_4_ = (float)(SUB168(auVar25 | _DAT_001dfc30,8) - DAT_001dfc30._8_8_);
  auVar19._8_8_ = 0;
  divps(auVar19,_DAT_001dc020);
  auVar27 = auVar27 & _DAT_001dfbf0;
  auVar28._0_4_ = (float)auVar27._0_4_;
  auVar28._4_4_ = (float)auVar27._4_4_;
  auVar28._8_4_ = (float)auVar27._8_4_;
  auVar28._12_4_ = (float)auVar27._12_4_;
  divps(auVar28,_DAT_001dc020);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_38 = this->m_WorldZoom * 5.0;
  local_40 = CONCAT44(fVar26,fVar21);
  local_34 = local_38;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_40,1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::DoQuadPoint(CQuad *pQuad, int QuadIndex, int V)
{
	void *pID = &pQuad->m_aPoints[V];

	float wx = UI()->MouseWorldX();
	float wy = UI()->MouseWorldY();

	float px = fx2f(pQuad->m_aPoints[V].x);
	float py = fx2f(pQuad->m_aPoints[V].y);

	float dx = (px - wx)/m_WorldZoom;
	float dy = (py - wy)/m_WorldZoom;
	if(dx*dx+dy*dy < 50)
		UI()->SetHotItem(pID);

	// draw selection background
	if(m_SelectedQuad == QuadIndex && m_SelectedPoints&(1<<V))
	{
		Graphics()->SetColor(0,0,0,1);
		IGraphics::CQuadItem QuadItem(px, py, 7.0f*m_WorldZoom, 7.0f*m_WorldZoom);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	enum
	{
		OP_NONE=0,
		OP_MOVEPOINT,
		OP_MOVEUV,
		OP_CONTEXT_MENU
	};

	static bool s_Moved;
	static int s_Operation = OP_NONE;

	bool IgnoreGrid;
	if(Input()->KeyIsPressed(KEY_LALT) || Input()->KeyIsPressed(KEY_RALT))
		IgnoreGrid = true;
	else
		IgnoreGrid = false;

	vec4 pointColor;

	if(UI()->CheckActiveItem(pID))
	{
		float dx = m_MouseDeltaWx;
		float dy = m_MouseDeltaWy;
		if(!s_Moved)
		{
			if(dx*dx+dy*dy > 0.5f)
				s_Moved = true;
		}

		if(s_Moved)
		{
			if(s_Operation == OP_MOVEPOINT)
			{
				if(m_GridActive && !IgnoreGrid)
				{
					for(int m = 0; m < 4; m++)
						if(m_SelectedPoints&(1<<m))
						{
							int LineDistance = GetLineDistance();

							float x = 0.0f;
							float y = 0.0f;
							if(wx >= 0)
								x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
							else
								x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
							if(wy >= 0)
								y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
							else
								y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

							pQuad->m_aPoints[m].x = f2fx(x);
							pQuad->m_aPoints[m].y = f2fx(y);
						}
				}
				else
				{
					for(int m = 0; m < 4; m++)
						if(m_SelectedPoints&(1<<m))
						{
							pQuad->m_aPoints[m].x += f2fx(dx);
							pQuad->m_aPoints[m].y += f2fx(dy);
						}
				}
			}
			else if(s_Operation == OP_MOVEUV)
			{
				for(int m = 0; m < 4; m++)
					if(m_SelectedPoints&(1<<m))
					{
						// 0,2;1,3 - line x
						// 0,1;2,3 - line y

						pQuad->m_aTexcoords[m].x += f2fx(dx*0.001f);
						pQuad->m_aTexcoords[(m+2)%4].x += f2fx(dx*0.001f);

						pQuad->m_aTexcoords[m].y += f2fx(dy*0.001f);
						pQuad->m_aTexcoords[m^1].y += f2fx(dy*0.001f);
					}
			}
		}

		if(s_Operation == OP_CONTEXT_MENU)
		{
			if(!UI()->MouseButton(1))
			{
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 150, this, PopupPoint);
				UI()->SetActiveItem(0);
			}
		}
		else
		{
			if(!UI()->MouseButton(0))
			{
				if(!s_Moved)
				{
					if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
						m_SelectedPoints ^= 1<<V;
					else
						m_SelectedPoints = 1<<V;
				}
				m_LockMouse = false;
				UI()->SetActiveItem(0);
			}
		}

		pointColor = HexToRgba(Config()->m_EdColorQuadPointActive);
	}
	else if(UI()->HotItem() == pID)
	{
		ms_pUiGotContext = pID;

		pointColor = HexToRgba(Config()->m_EdColorQuadPointHover);
		m_pTooltip = "Left mouse button to move. Hold shift to move the texture. Hold alt to ignore grid.";

		if(UI()->MouseButton(0))
		{
			UI()->SetActiveItem(pID);
			s_Moved = false;
			if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
			{
				s_Operation = OP_MOVEUV;
				m_LockMouse = true;
			}
			else
				s_Operation = OP_MOVEPOINT;

			if(!(m_SelectedPoints&(1<<V)))
			{
				if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
					m_SelectedPoints |= 1<<V;
				else
					m_SelectedPoints = 1<<V;
				s_Moved = true;
			}

			m_SelectedQuad = QuadIndex;
		}
		else if(UI()->MouseButton(1))
		{
			s_Operation = OP_CONTEXT_MENU;
			m_SelectedQuad = QuadIndex;
			UI()->SetActiveItem(pID);
			if(!(m_SelectedPoints&(1<<V)))
			{
				if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
					m_SelectedPoints |= 1<<V;
				else
					m_SelectedPoints = 1<<V;
				s_Moved = true;
			}
		}
	}
	else
		pointColor = HexToRgba(Config()->m_EdColorQuadPoint);

	Graphics()->SetColor(pointColor.r, pointColor.g, pointColor.b, pointColor.a);
	IGraphics::CQuadItem QuadItem(px, py, 5.0f*m_WorldZoom, 5.0f*m_WorldZoom);
	Graphics()->QuadsDraw(&QuadItem, 1);
}